

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixCheckReservedLock(sqlite3_file *id,int *pResOut)

{
  undefined8 pFile_00;
  int iVar1;
  int *piVar2;
  short local_48 [4];
  flock lock;
  unixFile *pFile;
  int reserved;
  int rc;
  int *pResOut_local;
  sqlite3_file *id_local;
  
  pFile._4_4_ = 0;
  lock._24_8_ = id;
  sqlite3_mutex_enter((sqlite3_mutex *)(id[2].pMethods)->xRead);
  pFile._0_4_ = (uint)(1 < *(byte *)(*(long *)(lock._24_8_ + 0x10) + 0x20));
  if (((uint)pFile == 0) && (*(char *)(*(long *)(lock._24_8_ + 0x10) + 0x21) == '\0')) {
    local_48[1] = 0;
    lock._0_8_ = SEXT48(sqlite3PendingByte + 1);
    lock.l_start = 1;
    local_48[0] = 1;
    iVar1 = (*aSyscall[7].pCurrent)((ulong)*(uint *)(lock._24_8_ + 0x18),5,local_48);
    pFile_00 = lock._24_8_;
    if (iVar1 == 0) {
      if (local_48[0] != 2) {
        pFile._0_4_ = 1;
      }
    }
    else {
      pFile._4_4_ = 0xe0a;
      piVar2 = __errno_location();
      storeLastErrno((unixFile *)pFile_00,*piVar2);
    }
  }
  sqlite3_mutex_leave(*(sqlite3_mutex **)(*(long *)(lock._24_8_ + 0x10) + 0x10));
  *pResOut = (uint)pFile;
  return pFile._4_4_;
}

Assistant:

static int unixCheckReservedLock(sqlite3_file *id, int *pResOut){
  int rc = SQLITE_OK;
  int reserved = 0;
  unixFile *pFile = (unixFile*)id;

  SimulateIOError( return SQLITE_IOERR_CHECKRESERVEDLOCK; );

  assert( pFile );
  assert( pFile->eFileLock<=SHARED_LOCK );
  sqlite3_mutex_enter(pFile->pInode->pLockMutex);

  /* Check if a thread in this process holds such a lock */
  if( pFile->pInode->eFileLock>SHARED_LOCK ){
    reserved = 1;
  }

  /* Otherwise see if some other process holds it.
  */
#ifndef __DJGPP__
  if( !reserved && !pFile->pInode->bProcessLock ){
    struct flock lock;
    lock.l_whence = SEEK_SET;
    lock.l_start = RESERVED_BYTE;
    lock.l_len = 1;
    lock.l_type = F_WRLCK;
    if( osFcntl(pFile->h, F_GETLK, &lock) ){
      rc = SQLITE_IOERR_CHECKRESERVEDLOCK;
      storeLastErrno(pFile, errno);
    } else if( lock.l_type!=F_UNLCK ){
      reserved = 1;
    }
  }
#endif
  
  sqlite3_mutex_leave(pFile->pInode->pLockMutex);
  OSTRACE(("TEST WR-LOCK %d %d %d (unix)\n", pFile->h, rc, reserved));

  *pResOut = reserved;
  return rc;
}